

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O3

int google::protobuf::compiler::java::GetExperimentalJavaFieldTypeForPacked(FieldDescriptor *field)

{
  FieldDescriptor FVar1;
  int iVar2;
  LogMessage *pLVar3;
  FieldDescriptor *local_50;
  LogMessage local_48;
  
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_48._0_8_ = FieldDescriptor::TypeOnceInit;
    local_50 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_48,&local_50)
    ;
  }
  FVar1 = field[2];
  if ((byte)FVar1 < 9) {
    iVar2 = (byte)FVar1 + 0x22;
  }
  else if ((byte)FVar1 < 0xd) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x401);
    pLVar3 = internal::LogMessage::operator<<(&local_48,(string *)(*(long *)(field + 8) + 0x20));
    pLVar3 = internal::LogMessage::operator<<(pLVar3," can\'t be packed.");
    internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar3);
    internal::LogMessage::~LogMessage(&local_48);
    iVar2 = 0;
  }
  else {
    iVar2 = (byte)FVar1 + 0x1e;
  }
  return iVar2;
}

Assistant:

int GetExperimentalJavaFieldTypeForPacked(const FieldDescriptor* field) {
  int result = field->type();
  if (result < FieldDescriptor::TYPE_STRING) {
    return result + 34;
  } else if (result > FieldDescriptor::TYPE_BYTES) {
    return result + 30;
  } else {
    GOOGLE_LOG(FATAL) << field->full_name() << " can't be packed.";
    return 0;
  }
}